

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 452.test.cpp
# Opt level: O3

string * chunkLNU2_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 9.223500+4 2.330248+2          0          2          0          09228 1452     \n 0.000000+0 0.000000+0          0          0          1          49228 1452     \n          4          2                                            9228 1452     \n 1.000000-5 2.436700+0 2.530000-2 2.436700+0 5.000000-2 2.436700+09228 1452     \n 2.000000+7 5.209845+0                                            9228 1452     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkLNU2() {
  return
    " 9.223500+4 2.330248+2          0          2          0          09228 1452     \n"
    " 0.000000+0 0.000000+0          0          0          1          49228 1452     \n"
    "          4          2                                            9228 1452     \n"
    " 1.000000-5 2.436700+0 2.530000-2 2.436700+0 5.000000-2 2.436700+09228 1452     \n"
    " 2.000000+7 5.209845+0                                            9228 1452     \n";
}